

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Sphere(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement_Geometry3D *pCVar7;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  reference v;
  aiVector3t<float> aVar8;
  allocator<char> local_111;
  string local_110;
  value_type local_f0;
  value_type local_e0;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_d0;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_c8;
  iterator it;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist;
  uint tess;
  undefined1 local_98 [8];
  string an;
  uint local_64;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  string local_50 [3];
  bool solid;
  ai_real radius;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  ne._4_4_ = 1.0;
  ne._3_1_ = 1;
  _idx_end = (CX3DImporter_NodeElement_Geometry3D *)0x0;
  local_64 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_64 < iVar2; local_64 = local_64 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_64);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,(char *)CONCAT44(extraout_var,iVar3),
               (allocator<char> *)((long)&tess + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&tess + 3));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_64);
      std::__cxx11::string::operator=(local_50,(char *)CONCAT44(extraout_var_00,iVar3));
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_64);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"bboxCenter");
        if (((!bVar1) &&
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_98,"bboxSize"), !bVar1)) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,"containerField"), !bVar1)) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"radius");
          if (bVar1) {
            ne._4_4_ = XML_ReadNode_GetAttrVal_AsFloat(this,local_64);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,"solid");
            if (bVar1) {
              ne._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_64);
            }
            else {
              Throw_IncorrectAttr(this,(string *)local_98);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_Sphere,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
    pCVar7 = (CX3DImporter_NodeElement_Geometry3D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry3D::CX3DImporter_NodeElement_Geometry3D
              (pCVar7,ENET_Sphere,this->NodeElement_Cur);
    _idx_end = pCVar7;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,local_50);
    }
    StandardShapes::MakeSphere
              (3,(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
    local_c8._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
    while( true ) {
      local_d0._M_current =
           (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
      bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
      if (!bVar1) break;
      this_00 = &_idx_end->Vertices;
      v = __gnu_cxx::
          __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
          ::operator*(&local_c8);
      aVar8 = ::operator*(v,ne._4_4_);
      local_f0.z = aVar8.z;
      local_f0._0_8_ = aVar8._0_8_;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (this_00,&local_e0);
      __gnu_cxx::
      __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
      ::operator++(&local_c8);
    }
    _idx_end->Solid = (bool)(ne._3_1_ & 1);
    _idx_end->NumIndices = 3;
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar7 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Sphere",&local_111);
      ParseNode_Metadata(this,&pCVar7->super_CX3DImporter_NodeElement,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it);
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Sphere()
{
    std::string use, def;
    ai_real radius = 1;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Sphere, ne);
	}
	else
	{
		const unsigned int tess = 3;///TODO: IME tessellation factor through ai_property

		std::vector<aiVector3D> tlist;

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Sphere, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		StandardShapes::MakeSphere(tess, tlist);
		// copy data from temp array and apply scale
		for(std::vector<aiVector3D>::iterator it = tlist.begin(); it != tlist.end(); ++it)
		{
			((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices.push_back(*it * radius);
		}

		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Sphere");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}